

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_server.cpp
# Opt level: O0

void __thiscall zmq::plain_server_t::~plain_server_t(plain_server_t *this)

{
  plain_server_t *in_RDI;
  void **in_stack_ffffffffffffffe8;
  
  ~plain_server_t(in_RDI,in_stack_ffffffffffffffe8);
  mechanism_base_t::~mechanism_base_t((mechanism_base_t *)0x317ecd);
  return;
}

Assistant:

zmq::plain_server_t::~plain_server_t ()
{
}